

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int parse_device(dev_t *pdev,archive *a,char *val)

{
  unsigned_long uVar1;
  int iVar2;
  long local_78;
  char *error;
  dev_t result;
  pack_t *pack;
  char *pcStack_58;
  int argc;
  char *dev;
  char *p;
  unsigned_long numbers [3];
  char *local_28;
  char *val_local;
  archive *a_local;
  dev_t *pdev_local;
  
  local_78 = 0;
  local_28 = val;
  val_local = (char *)a;
  a_local = (archive *)pdev;
  memset(pdev,0,8);
  pcStack_58 = strchr(local_28,0x2c);
  if (pcStack_58 == (char *)0x0) {
    error = (char *)mtree_atol(&local_28);
LAB_001d8fa5:
    *(char **)a_local = error;
    pdev_local._4_4_ = 0;
  }
  else {
    *pcStack_58 = '\0';
    pcStack_58 = pcStack_58 + 1;
    result = (dev_t)pack_find(local_28);
    if ((pack_t *)result == (pack_t *)0x0) {
      archive_set_error((archive *)val_local,0x54,"Unknown format `%s\'",local_28);
      pdev_local._4_4_ = -0x14;
    }
    else {
      pack._4_4_ = 0;
      do {
        dev = la_strsep(&stack0xffffffffffffffa8,",");
        if (dev == (char *)0x0) {
          if (pack._4_4_ < 2) {
            archive_set_error((archive *)val_local,0x54,"Not enough arguments");
            return -0x14;
          }
          error = (char *)(*(code *)result)(pack._4_4_,&p,&local_78);
          if (local_78 != 0) {
            archive_set_error((archive *)val_local,0x54,"%s",local_78);
            return -0x14;
          }
          goto LAB_001d8fa5;
        }
        if (*dev == '\0') {
          archive_set_error((archive *)val_local,0x54,"Missing number");
          return -0x14;
        }
        uVar1 = mtree_atol(&dev);
        iVar2 = pack._4_4_ + 1;
        numbers[(long)pack._4_4_ + -1] = uVar1;
        pack._4_4_ = iVar2;
      } while (iVar2 < 4);
      archive_set_error((archive *)val_local,0x54,"Too many arguments");
      pdev_local._4_4_ = -0x14;
    }
  }
  return pdev_local._4_4_;
}

Assistant:

static int
parse_device(dev_t *pdev, struct archive *a, char *val)
{
#define MAX_PACK_ARGS 3
	unsigned long numbers[MAX_PACK_ARGS];
	char *p, *dev;
	int argc;
	pack_t *pack;
	dev_t result;
	const char *error = NULL;

	memset(pdev, 0, sizeof(*pdev));
	if ((dev = strchr(val, ',')) != NULL) {
		/*
		 * Device's major/minor are given in a specified format.
		 * Decode and pack it accordingly.
		 */
		*dev++ = '\0';
		if ((pack = pack_find(val)) == NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown format `%s'", val);
			return ARCHIVE_WARN;
		}
		argc = 0;
		while ((p = la_strsep(&dev, ",")) != NULL) {
			if (*p == '\0') {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing number");
				return ARCHIVE_WARN;
			}
			numbers[argc++] = mtree_atol(&p);
			if (argc > MAX_PACK_ARGS) {
				archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too many arguments");
				return ARCHIVE_WARN;
			}
		}
		if (argc < 2) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Not enough arguments");
			return ARCHIVE_WARN;
		}
		result = (*pack)(argc, numbers, &error);
		if (error != NULL) {
			archive_set_error(a, ARCHIVE_ERRNO_FILE_FORMAT,
			    "%s", error);
			return ARCHIVE_WARN;
		}
	} else {
		/* file system raw value. */
		result = (dev_t)mtree_atol(&val);
	}
	*pdev = result;
	return ARCHIVE_OK;
#undef MAX_PACK_ARGS
}